

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CheckerDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerDeclarationSyntax,slang::syntax::CheckerDeclarationSyntax_const&>
          (BumpAllocator *this,CheckerDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  AssertionItemPortListSyntax *pAVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  CheckerDeclarationSyntax *pCVar18;
  
  pCVar18 = (CheckerDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CheckerDeclarationSyntax *)this->endPtr < pCVar18 + 1) {
    pCVar18 = (CheckerDeclarationSyntax *)allocateSlow(this,0xd8,8);
  }
  else {
    this->head->current = (byte *)(pCVar18 + 1);
  }
  (pCVar18->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar18->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar18->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pCVar18->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar6 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6
  ;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar18->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar18->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b0da0;
  uVar7 = (args->keyword).field_0x2;
  NVar8.raw = (args->keyword).numFlags.raw;
  uVar9 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  TVar10 = (args->name).kind;
  uVar11 = (args->name).field_0x2;
  NVar12.raw = (args->name).numFlags.raw;
  uVar13 = (args->name).rawLen;
  pIVar4 = (args->name).info;
  pAVar5 = args->portList;
  TVar14 = (args->semi).kind;
  uVar15 = (args->semi).field_0x2;
  NVar16.raw = (args->semi).numFlags.raw;
  uVar17 = (args->semi).rawLen;
  (pCVar18->keyword).kind = (args->keyword).kind;
  (pCVar18->keyword).field_0x2 = uVar7;
  (pCVar18->keyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar18->keyword).rawLen = uVar9;
  (pCVar18->keyword).info = pIVar3;
  (pCVar18->name).kind = TVar10;
  (pCVar18->name).field_0x2 = uVar11;
  (pCVar18->name).numFlags = (NumericTokenFlags)NVar12.raw;
  (pCVar18->name).rawLen = uVar13;
  (pCVar18->name).info = pIVar4;
  pCVar18->portList = pAVar5;
  (pCVar18->semi).kind = TVar14;
  (pCVar18->semi).field_0x2 = uVar15;
  (pCVar18->semi).numFlags = (NumericTokenFlags)NVar16.raw;
  (pCVar18->semi).rawLen = uVar17;
  (pCVar18->semi).info = (args->semi).info;
  uVar6 = *(undefined4 *)&(args->members).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->members).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar18->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->members).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar18->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (pCVar18->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar18->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->members).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar18->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (pCVar18->members).super_SyntaxListBase.childCount =
       (args->members).super_SyntaxListBase.childCount;
  sVar2 = (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pCVar18->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar18->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar18->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b0e28;
  uVar7 = (args->end).field_0x2;
  NVar8.raw = (args->end).numFlags.raw;
  uVar9 = (args->end).rawLen;
  pIVar3 = (args->end).info;
  (pCVar18->end).kind = (args->end).kind;
  (pCVar18->end).field_0x2 = uVar7;
  (pCVar18->end).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar18->end).rawLen = uVar9;
  (pCVar18->end).info = pIVar3;
  pCVar18->endBlockName = args->endBlockName;
  return pCVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }